

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

string * module_for_header(string *__return_storage_ptr__,string *header)

{
  int iVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  string module;
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  ulong local_70;
  long local_68 [2];
  long *local_58;
  size_t local_50;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&s_header_map_abi_cxx11_._M_t,header);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &s_header_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(iVar2._M_node + 2),
               (long)&(iVar2._M_node[2]._M_parent)->_M_color + *(long *)(iVar2._M_node + 2));
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&local_98,(ulong)header);
  iVar1 = std::__cxx11::string::compare((char *)&local_98);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (iVar1 != 0) {
    std::__cxx11::string::substr((ulong)&local_98,(ulong)header);
    iVar1 = std::__cxx11::string::compare((char *)&local_98);
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if (iVar1 != 0) goto LAB_0010de82;
  }
  std::__cxx11::string::substr((ulong)&local_98,(ulong)header);
  std::__cxx11::string::operator=((string *)header,(string *)&local_98);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  bVar5 = (_Rb_tree_header *)
          s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
          &s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
  if (!bVar5) {
    local_38 = &__return_storage_ptr__->field_2;
    p_Var3 = s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      if (local_90 != 0) {
        lVar4 = 0;
        do {
          if (*(char *)((long)local_98 + lVar4) == '~') {
            *(undefined1 *)((long)local_98 + lVar4) = 0x2f;
          }
          lVar4 = lVar4 + 1;
        } while (local_90 != lVar4);
      }
      std::__cxx11::string::substr((ulong)&local_58,(ulong)header);
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,local_98,local_90 + (long)local_98);
      std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
      if (local_50 == local_70) {
        if (local_50 == 0) {
          bVar6 = true;
        }
        else {
          iVar1 = bcmp(local_58,local_78,local_50);
          bVar6 = iVar1 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      if (bVar6) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*(long *)(p_Var3 + 1),
                   (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
        if (bVar6) {
          if (!bVar5) {
            return __return_storage_ptr__;
          }
          break;
        }
      }
      else if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar5 = (_Rb_tree_header *)p_Var3 == &s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
    } while (!bVar5);
  }
LAB_0010de82:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string module_for_header( std::string header )
{
    {
        std::map<std::string, std::string>::const_iterator i = s_header_map.find( header );

        if( i != s_header_map.end() )
        {
            return i->second;
        }
    }

    if( header.substr( 0, 5 ) == "libs/" )
    {
        header = header.substr( 5 );
    }
    else if( header.substr( 0, 5 ) == "test/" )
    {
        header = header.substr( 5 );
    }
    else
    {
        return std::string();
    }

    for( std::set<std::string>::const_iterator i = s_modules.begin(); i != s_modules.end(); ++i )
    {
        std::string module = *i;
        std::replace( module.begin(), module.end(), '~', '/' );

        if( header.substr( 0, module.size() + 1 ) == module + '/' )
        {
            return *i;
        }
    }

    return std::string();
}